

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_addMethodNode
          (UA_Server *server,UA_NodeId requestedNewNodeId,UA_NodeId parentNodeId,
          UA_NodeId referenceTypeId,UA_QualifiedName browseName,UA_MethodAttributes attr,
          UA_MethodCallback method,void *handle,size_t inputArgumentsSize,
          UA_Argument *inputArguments,size_t outputArgumentsSize,UA_Argument *outputArguments,
          UA_NodeId *outNewNodeId)

{
  UA_Node *pUVar1;
  UA_Node *pUVar2;
  UA_NodeId local_280;
  UA_LocalizedText local_268;
  UA_LocalizedText local_248;
  UA_QualifiedName local_228;
  UA_Node *local_210;
  UA_VariableNode *outputArgumentsVariableNode;
  anon_union_16_4_621dfe33_for_identifier local_200;
  UA_LocalizedText local_1f0;
  UA_LocalizedText local_1d0;
  UA_QualifiedName local_1b0;
  UA_Node *local_198;
  UA_VariableNode *inputArgumentsVariableNode;
  UA_NodeId propertytype;
  UA_NodeId hasproperty;
  undefined1 auStack_158 [4];
  UA_StatusCode retval;
  UA_NodeId newMethodId;
  UA_AddNodesItem item;
  UA_MethodNode *node;
  size_t outputArgumentsSize_local;
  UA_Argument *inputArguments_local;
  size_t inputArgumentsSize_local;
  void *handle_local;
  UA_MethodCallback method_local;
  UA_Server *server_local;
  
  pUVar1 = UA_NodeStore_newNode(UA_NODECLASS_METHOD);
  if (pUVar1 == (UA_Node *)0x0) {
    server_local._4_4_ = 0x80030000;
  }
  else {
    UA_AddNodesItem_init((UA_AddNodesItem *)((long)&newMethodId.identifier + 8));
    copyStandardAttributes
              (pUVar1,(UA_AddNodesItem *)((long)&newMethodId.identifier + 8),
               (UA_NodeAttributes *)&attr);
    *(byte *)&pUVar1[1].nodeId.namespaceIndex = attr.executable & 1;
    *(byte *)((long)&pUVar1[1].nodeId.namespaceIndex + 1) = attr.userExecutable & 1;
    pUVar1[1].nodeId.identifier.string.data = (UA_Byte *)method;
    pUVar1[1].nodeId.identifier.string.length = (size_t)handle;
    UA_NodeId_init((UA_NodeId *)auStack_158);
    server_local._4_4_ =
         Service_AddNodes_existing
                   (server,&adminSession,pUVar1,&parentNodeId,&referenceTypeId,&UA_NODEID_NULL,
                    (UA_InstantiationCallback *)0x0,(UA_NodeId *)auStack_158);
    if (server_local._4_4_ == 0) {
      UA_NODEID_NUMERIC((UA_NodeId *)((long)&propertytype.identifier + 8),0,0x2e);
      UA_NODEID_NUMERIC((UA_NodeId *)&inputArgumentsVariableNode,0,0x44);
      if (inputArgumentsSize != 0) {
        pUVar2 = UA_NodeStore_newNode(UA_NODECLASS_VARIABLE);
        (pUVar2->nodeId).namespaceIndex = auStack_158._0_2_;
        local_198 = pUVar2;
        UA_QUALIFIEDNAME_ALLOC(&local_1b0,0,"InputArguments");
        pUVar1 = local_198;
        (pUVar2->browseName).namespaceIndex = local_1b0.namespaceIndex;
        *(undefined6 *)&(pUVar2->browseName).field_0x2 = local_1b0._2_6_;
        (pUVar2->browseName).name.length = local_1b0.name.length;
        (pUVar2->browseName).name.data = local_1b0.name.data;
        UA_LOCALIZEDTEXT_ALLOC(&local_1d0,"en_US","InputArguments");
        pUVar2 = local_198;
        (pUVar1->displayName).locale.length = local_1d0.locale.length;
        (pUVar1->displayName).locale.data = local_1d0.locale.data;
        (pUVar1->displayName).text.length = local_1d0.text.length;
        (pUVar1->displayName).text.data = local_1d0.text.data;
        UA_LOCALIZEDTEXT_ALLOC(&local_1f0,"en_US","InputArguments");
        pUVar1 = local_198;
        (pUVar2->description).locale.length = local_1f0.locale.length;
        (pUVar2->description).locale.data = local_1f0.locale.data;
        (pUVar2->description).text.length = local_1f0.text.length;
        (pUVar2->description).text.data = local_1f0.text.data;
        local_198[1].nodeClass = UA_NODECLASS_OBJECT;
        local_198[2].browseName.name.length = 0x40c3880000000000;
        if (((auStack_158._0_2_ == 0) && (retval == 0)) && (newMethodId._0_4_ == 0x2ce4)) {
          UA_NODEID_NUMERIC((UA_NodeId *)&outputArgumentsVariableNode,0,0x2ce5);
          *(UA_VariableNode **)&pUVar1->nodeId = outputArgumentsVariableNode;
          (pUVar1->nodeId).identifier.string.length = local_200.string.length;
          (pUVar1->nodeId).identifier.string.data = local_200.string.data;
        }
        UA_Variant_setArrayCopy
                  ((UA_Variant *)&local_198[1].displayName.locale.data,inputArguments,
                   inputArgumentsSize,UA_TYPES + 0x39);
        *(byte *)&local_198[1].displayName.locale.length =
             (byte)local_198[1].displayName.locale.length & 0xfe | 1;
        Service_AddNodes_existing
                  (server,&adminSession,local_198,(UA_NodeId *)auStack_158,
                   (UA_NodeId *)((long)&propertytype.identifier + 8),
                   (UA_NodeId *)&inputArgumentsVariableNode,(UA_InstantiationCallback *)0x0,
                   (UA_NodeId *)0x0);
      }
      if (outputArgumentsSize != 0) {
        pUVar2 = UA_NodeStore_newNode(UA_NODECLASS_VARIABLE);
        (pUVar2->nodeId).namespaceIndex = auStack_158._0_2_;
        local_210 = pUVar2;
        UA_QUALIFIEDNAME_ALLOC(&local_228,0,"OutputArguments");
        pUVar1 = local_210;
        (pUVar2->browseName).namespaceIndex = local_228.namespaceIndex;
        *(undefined6 *)&(pUVar2->browseName).field_0x2 = local_228._2_6_;
        (pUVar2->browseName).name.length = local_228.name.length;
        (pUVar2->browseName).name.data = local_228.name.data;
        UA_LOCALIZEDTEXT_ALLOC(&local_248,"en_US","OutputArguments");
        pUVar2 = local_210;
        (pUVar1->displayName).locale.length = local_248.locale.length;
        (pUVar1->displayName).locale.data = local_248.locale.data;
        (pUVar1->displayName).text.length = local_248.text.length;
        (pUVar1->displayName).text.data = local_248.text.data;
        UA_LOCALIZEDTEXT_ALLOC(&local_268,"en_US","OutputArguments");
        pUVar1 = local_210;
        (pUVar2->description).locale.length = local_268.locale.length;
        (pUVar2->description).locale.data = local_268.locale.data;
        (pUVar2->description).text.length = local_268.text.length;
        (pUVar2->description).text.data = local_268.text.data;
        local_210[1].nodeClass = UA_NODECLASS_OBJECT;
        if (((auStack_158._0_2_ == 0) && (retval == 0)) && (newMethodId._0_4_ == 0x2ce4)) {
          UA_NODEID_NUMERIC(&local_280,0,0x2ce6);
          (pUVar1->nodeId).namespaceIndex = local_280.namespaceIndex;
          *(undefined2 *)&(pUVar1->nodeId).field_0x2 = local_280._2_2_;
          (pUVar1->nodeId).identifierType = local_280.identifierType;
          (pUVar1->nodeId).identifier.string.length = local_280.identifier.string.length;
          (pUVar1->nodeId).identifier.string.data = local_280.identifier.string.data;
        }
        UA_Variant_setArrayCopy
                  ((UA_Variant *)&local_210[1].displayName.locale.data,outputArguments,
                   outputArgumentsSize,UA_TYPES + 0x39);
        *(byte *)&local_210[1].displayName.locale.length =
             (byte)local_210[1].displayName.locale.length & 0xfe | 1;
        Service_AddNodes_existing
                  (server,&adminSession,local_210,(UA_NodeId *)auStack_158,
                   (UA_NodeId *)((long)&propertytype.identifier + 8),
                   (UA_NodeId *)&inputArgumentsVariableNode,(UA_InstantiationCallback *)0x0,
                   (UA_NodeId *)0x0);
      }
      if (outNewNodeId == (UA_NodeId *)0x0) {
        UA_NodeId_deleteMembers((UA_NodeId *)auStack_158);
      }
      else {
        outNewNodeId->namespaceIndex = auStack_158._0_2_;
        *(undefined2 *)&outNewNodeId->field_0x2 = auStack_158._2_2_;
        outNewNodeId->identifierType = retval;
        (outNewNodeId->identifier).string.length =
             CONCAT44(newMethodId.identifierType,newMethodId._0_4_);
        (outNewNodeId->identifier).string.data = (UA_Byte *)newMethodId.identifier.string.length;
      }
    }
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Server_addMethodNode(UA_Server *server, const UA_NodeId requestedNewNodeId,
                        const UA_NodeId parentNodeId, const UA_NodeId referenceTypeId,
                        const UA_QualifiedName browseName, const UA_MethodAttributes attr,
                        UA_MethodCallback method, void *handle,
                        size_t inputArgumentsSize, const UA_Argument* inputArguments,
                        size_t outputArgumentsSize, const UA_Argument* outputArguments,
                        UA_NodeId *outNewNodeId) {
    UA_MethodNode *node = UA_NodeStore_newMethodNode();
    if(!node)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    UA_AddNodesItem item;
    UA_AddNodesItem_init(&item);
    item.requestedNewNodeId.nodeId = requestedNewNodeId;
    item.browseName = browseName;
    copyStandardAttributes((UA_Node*)node, &item, (const UA_NodeAttributes*)&attr);
    node->executable = attr.executable;
    node->userExecutable = attr.userExecutable;
    node->attachedMethod = method;
    node->methodHandle = handle;

    /* Add the node */
    UA_NodeId newMethodId;
    UA_NodeId_init(&newMethodId);
    UA_RCU_LOCK();
    UA_StatusCode retval = Service_AddNodes_existing(server, &adminSession, (UA_Node*)node, &parentNodeId,
                                                     &referenceTypeId, &UA_NODEID_NULL, NULL, &newMethodId);
    UA_RCU_UNLOCK();
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    const UA_NodeId hasproperty = UA_NODEID_NUMERIC(0, UA_NS0ID_HASPROPERTY);
    const UA_NodeId propertytype = UA_NODEID_NUMERIC(0, UA_NS0ID_PROPERTYTYPE);

    if(inputArgumentsSize > 0) {
        UA_VariableNode *inputArgumentsVariableNode = UA_NodeStore_newVariableNode();
        inputArgumentsVariableNode->nodeId.namespaceIndex = newMethodId.namespaceIndex;
        inputArgumentsVariableNode->browseName = UA_QUALIFIEDNAME_ALLOC(0, "InputArguments");
        inputArgumentsVariableNode->displayName = UA_LOCALIZEDTEXT_ALLOC("en_US", "InputArguments");
        inputArgumentsVariableNode->description = UA_LOCALIZEDTEXT_ALLOC("en_US", "InputArguments");
        inputArgumentsVariableNode->valueRank = 1;

        /* UAExpert creates a monitoreditem on inputarguments ... */
        inputArgumentsVariableNode->minimumSamplingInterval = 10000.0f;

        //TODO: 0.3 work item: the addMethodNode API does not have the possibility to set nodeIDs
        //actually we need to change the signature to pass UA_NS0ID_SERVER_GETMONITOREDITEMS_INPUTARGUMENTS
        //and UA_NS0ID_SERVER_GETMONITOREDITEMS_OUTPUTARGUMENTS into the function :/
        if(newMethodId.namespaceIndex == 0 &&
           newMethodId.identifierType == UA_NODEIDTYPE_NUMERIC &&
           newMethodId.identifier.numeric == UA_NS0ID_SERVER_GETMONITOREDITEMS) {
            inputArgumentsVariableNode->nodeId =
                UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_GETMONITOREDITEMS_INPUTARGUMENTS);
        }
        UA_Variant_setArrayCopy(&inputArgumentsVariableNode->value.data.value.value,
                                inputArguments, inputArgumentsSize,
                                &UA_TYPES[UA_TYPES_ARGUMENT]);
        inputArgumentsVariableNode->value.data.value.hasValue = true;
        UA_RCU_LOCK();
        // todo: check if adding succeeded
        Service_AddNodes_existing(server, &adminSession, (UA_Node*)inputArgumentsVariableNode,
                                  &newMethodId, &hasproperty, &propertytype, NULL, NULL);
        UA_RCU_UNLOCK();
    }

    if(outputArgumentsSize > 0) {
        /* create OutputArguments */
        UA_VariableNode *outputArgumentsVariableNode  = UA_NodeStore_newVariableNode();
        outputArgumentsVariableNode->nodeId.namespaceIndex = newMethodId.namespaceIndex;
        outputArgumentsVariableNode->browseName  = UA_QUALIFIEDNAME_ALLOC(0, "OutputArguments");
        outputArgumentsVariableNode->displayName = UA_LOCALIZEDTEXT_ALLOC("en_US", "OutputArguments");
        outputArgumentsVariableNode->description = UA_LOCALIZEDTEXT_ALLOC("en_US", "OutputArguments");
        outputArgumentsVariableNode->valueRank = 1;
        //FIXME: comment in line 882
        if(newMethodId.namespaceIndex == 0 &&
           newMethodId.identifierType == UA_NODEIDTYPE_NUMERIC &&
           newMethodId.identifier.numeric == UA_NS0ID_SERVER_GETMONITOREDITEMS) {
            outputArgumentsVariableNode->nodeId =
                UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_GETMONITOREDITEMS_OUTPUTARGUMENTS);
        }
        UA_Variant_setArrayCopy(&outputArgumentsVariableNode->value.data.value.value,
                                outputArguments, outputArgumentsSize,
                                &UA_TYPES[UA_TYPES_ARGUMENT]);
        outputArgumentsVariableNode->value.data.value.hasValue = true;
        UA_RCU_LOCK();
        // todo: check if adding succeeded
        Service_AddNodes_existing(server, &adminSession, (UA_Node*)outputArgumentsVariableNode,
                                  &newMethodId, &hasproperty, &propertytype, NULL, NULL);
        UA_RCU_UNLOCK();
    }

    if(outNewNodeId)
        *outNewNodeId = newMethodId;
    else
        UA_NodeId_deleteMembers(&newMethodId);
    return retval;
}